

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * match_capture(MatchState *ms,char *s,int l)

{
  ulong __n;
  int iVar1;
  undefined4 in_EDX;
  void *in_RSI;
  long in_RDI;
  size_t len;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar1 = check_capture((MatchState *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                        (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  __n = *(ulong *)(in_RDI + (long)iVar1 * 0x10 + 0x28);
  if ((__n <= (ulong)(*(long *)(in_RDI + 8) - (long)in_RSI)) &&
     (iVar1 = memcmp(*(void **)(in_RDI + 0x20 + (long)iVar1 * 0x10),in_RSI,__n), iVar1 == 0)) {
    return (char *)((long)in_RSI + __n);
  }
  return (char *)0x0;
}

Assistant:

static const char *match_capture(MatchState *ms, const char *s, int l)
{
  size_t len;
  l = check_capture(ms, l);
  len = (size_t)ms->capture[l].len;
  if ((size_t)(ms->src_end-s) >= len &&
      memcmp(ms->capture[l].init, s, len) == 0)
    return s+len;
  else
    return NULL;
}